

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::expression_is_constant_null(CompilerGLSL *this,uint32_t id)

{
  ulong uVar1;
  Constant *pCVar2;
  Variant *pVVar3;
  SPIRConstant *pSVar4;
  Constant *pCVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar6 = (ulong)id;
  if ((uVar6 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar3[uVar6].type == TypeConstant)) {
    pSVar4 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar6);
  }
  else {
    pSVar4 = (SPIRConstant *)0x0;
  }
  bVar10 = false;
  if (((pSVar4 != (SPIRConstant *)0x0) && (bVar10 = false, pSVar4->specialization == false)) &&
     ((pSVar4->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
      buffer_size == 0)) {
    uVar6 = (ulong)(pSVar4->m).columns;
    bVar10 = uVar6 == 0;
    if (!bVar10) {
      uVar7 = (ulong)(pSVar4->m).c[0].vecsize;
      pCVar5 = (pSVar4->m).c[0].r + 1;
      uVar8 = 0;
      bVar10 = false;
      do {
        if (uVar7 != 0) {
          if ((pSVar4->m).c[uVar8].r[0].u64 != 0) {
            return bVar10;
          }
          uVar9 = 0;
          do {
            if (uVar7 - 1 == uVar9) goto LAB_001f4a2e;
            uVar1 = uVar9 + 1;
            pCVar2 = pCVar5 + uVar9;
            uVar9 = uVar1;
          } while (pCVar2->u64 == 0);
          if (uVar1 < uVar7) {
            return bVar10;
          }
        }
LAB_001f4a2e:
        uVar8 = uVar8 + 1;
        pCVar5 = pCVar5 + 7;
        bVar10 = uVar6 <= uVar8;
      } while (uVar8 != uVar6);
    }
  }
  return bVar10;
}

Assistant:

bool CompilerGLSL::expression_is_constant_null(uint32_t id) const
{
	auto *c = maybe_get<SPIRConstant>(id);
	if (!c)
		return false;
	return c->constant_is_null();
}